

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regfileparser.cpp
# Opt level: O0

string * GetValueSpecFromSetSpec(string *__return_storage_ptr__,string *spec,size_t start)

{
  char *pcVar1;
  size_t eqpos;
  size_t eqpos_1;
  size_t endquote;
  size_t start_local;
  string *spec_local;
  
  pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)spec);
  if ((*pcVar1 != '\'') &&
     (pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)spec), *pcVar1 != '\"')) {
    std::__cxx11::string::find((char)spec,0x3d);
    std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)spec);
    return __return_storage_ptr__;
  }
  pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)spec);
  findendquote(spec,start + 1,*pcVar1);
  std::__cxx11::string::find((char)spec,0x3d);
  std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)spec);
  return __return_storage_ptr__;
}

Assistant:

std::string GetValueSpecFromSetSpec(const std::string& spec, size_t start)
{
    if (spec[start]=='\'' || spec[start]=='\"')
    {
        size_t endquote= findendquote(spec, start+1, spec[start]);
        //debug("GetValueSpecFromSetSpec:%s\n", spec.substr(endquote).c_str());

        //todo: check for missing quote.
        size_t eqpos= spec.find('=', endquote);
        return spec.substr(eqpos+1);
    }
    size_t eqpos= spec.find('=');

    //debug("GetValueSpecFromSetSpec:%s\n", spec.substr(eqpos+1).c_str());
    return spec.substr(eqpos+1);
}